

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDsdGlobal(Abc_Ntk_t *pNtk,int fVerbose,int fPrint,int fShort)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  DdManager *dd_00;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pNtkNew;
  DdManager *dd;
  int fShort_local;
  int fPrint_local;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                  ,0x45,"Abc_Ntk_t *Abc_NtkDsdGlobal(Abc_Ntk_t *, int, int, int)");
  }
  dd_00 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
  if (dd_00 == (DdManager *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (fVerbose != 0) {
      uVar2 = Cudd_ReadKeys(dd_00);
      uVar3 = Cudd_ReadDead(dd_00);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar2 - uVar3));
    }
    pNtk_local = Abc_NtkDsdInternal(pNtk,fVerbose,fPrint,fShort);
    Extra_StopManager(dd_00);
    if (pNtk_local == (Abc_Ntk_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar4 = Abc_NtkDup(pNtk->pExdc);
        pNtk_local->pExdc = pAVar4;
      }
      iVar1 = Abc_NtkCheck(pNtk_local);
      if (iVar1 == 0) {
        printf("Abc_NtkDsdGlobal: The network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDsdGlobal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort )
{
    DdManager * dd;
    Abc_Ntk_t * pNtkNew;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
    if ( dd == NULL )
        return NULL;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    // transform the result of mapping into a BDD network
    pNtkNew = Abc_NtkDsdInternal( pNtk, fVerbose, fPrint, fShort );
    Extra_StopManager( dd );
    if ( pNtkNew == NULL )
        return NULL;
    // copy EXDC network
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkDsdGlobal: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}